

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
quaternion_costruction_from_components::test_method(quaternion_costruction_from_components *this)

{
  undefined8 local_158;
  undefined8 local_150;
  undefined1 *local_148;
  undefined8 *local_140;
  undefined **local_138;
  undefined1 local_130;
  undefined8 *local_128;
  undefined8 **local_120;
  undefined1 local_118 [8];
  undefined8 local_110;
  shared_count sStack_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined8 *local_f0;
  undefined1 **local_e8;
  char *local_e0;
  char *local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3e);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00117be8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_140 = &local_150;
  local_150 = 0x3fb999999999999a;
  local_158 = 0x3fb999999999999a;
  local_118[0] = 1;
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_d8 = "";
  local_120 = &local_140;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_00117c60;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = 0;
  local_e8 = &local_148;
  local_100 = &PTR__lazy_ostream_00117c60;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_148 = (undefined1 *)&local_158;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_108);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x3f);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00117be8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_150 = 0x3fe0000000000000;
  local_158 = 0x3fe0000000000000;
  local_118[0] = 1;
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_d8 = "";
  local_140 = &local_150;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_00117c60;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00117c60;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_148;
  local_148 = (undefined1 *)&local_158;
  boost::test_tools::tt_detail::report_assertion
            (local_118,&local_d0,&local_e0,0x3f,1,2,2,"test.b()",&local_138,"0.5",&local_100);
  boost::detail::shared_count::~shared_count(&sStack_108);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x40);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00117be8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_150 = 0x3feccccccccccccd;
  local_158 = 0x3feccccccccccccd;
  local_118[0] = 1;
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_d8 = "";
  local_140 = &local_150;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_00117c60;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00117c60;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_148;
  local_148 = (undefined1 *)&local_158;
  boost::test_tools::tt_detail::report_assertion
            (local_118,&local_d0,&local_e0,0x40,1,2,2,"test.c()",&local_138,"0.9",&local_100);
  boost::detail::shared_count::~shared_count(&sStack_108);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x41);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00117be8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_150 = 0x3ff0000000000000;
  local_158 = CONCAT44(local_158._4_4_,1);
  local_118[0] = 1;
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_d8 = "";
  local_140 = &local_150;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_00117c60;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00117ca0;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_148;
  local_148 = (undefined1 *)&local_158;
  boost::test_tools::tt_detail::report_assertion
            (local_118,&local_d0,&local_e0,0x41,1,2,2,"test.d()",&local_138,"1",&local_100);
  boost::detail::shared_count::~shared_count(&sStack_108);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_costruction_from_components) {
    Quaternion<double> test(0.1,0.5,0.9,1);
    BOOST_CHECK_EQUAL(test.a(), 0.1);
    BOOST_CHECK_EQUAL(test.b(), 0.5);
    BOOST_CHECK_EQUAL(test.c(), 0.9);
    BOOST_CHECK_EQUAL(test.d(), 1);
}